

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll_test.cc
# Opt level: O2

void __thiscall
vw_dll_parsed_and_constructed_example_parity::test_method
          (vw_dll_parsed_and_constructed_example_parity *this)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float score_constructed;
  float score_parsed;
  undefined8 local_c8;
  long local_c0;
  undefined8 local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_c0 = VW_InitializeA("-q st --noconstant --quiet");
  local_c8 = VW_ReadExampleA(local_c0,"1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");
  lVar2 = VW_InitializeA("-q st --noconstant --quiet");
  uVar3 = VW_InitializeFeatureSpaces(2);
  uVar4 = VW_GetFeatureSpace(uVar3,0);
  VW_InitFeatures(uVar4,3);
  uVar5 = VW_SetFeatureSpace(lVar2,uVar4,"s");
  uVar6 = VW_HashFeatureA(lVar2,"p^the_man",uVar5);
  VW_SetFeature(0x3f800000,uVar4,0,uVar6);
  uVar6 = VW_HashFeatureA(lVar2,"w^the",uVar5);
  VW_SetFeature(0x3f800000,uVar4,1,uVar6);
  uVar5 = VW_HashFeatureA(lVar2,"w^man",uVar5);
  VW_SetFeature(0x3f800000,uVar4,2,uVar5);
  uVar4 = VW_GetFeatureSpace(uVar3,1);
  VW_InitFeatures(uVar4,3);
  uVar5 = VW_SetFeatureSpace(lVar2,uVar4,"t");
  uVar6 = VW_HashFeatureA(lVar2,"p^un_homme",uVar5);
  VW_SetFeature(0x3f800000,uVar4,0,uVar6);
  uVar6 = VW_HashFeatureA(lVar2,"w^un",uVar5);
  VW_SetFeature(0x3f800000,uVar4,1,uVar6);
  uVar5 = VW_HashFeatureA(lVar2,"w^homme",uVar5);
  VW_SetFeature(0x3f800000,uVar4,2,uVar5);
  local_b8 = uVar3;
  VW_ImportExample(lVar2,"1",uVar3,2);
  lVar1 = local_c0;
  uVar3 = local_c8;
  score_parsed = (float)VW_Learn(local_c0,local_c8);
  score_constructed = (float)VW_Learn(lVar2,uVar3);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3a);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_002e5760;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
            (&local_70,&local_80,0x3a,1,2,&score_parsed,"score_parsed",&score_constructed,
             "score_constructed");
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x3e);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_002e5760;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_70,&local_b0,0x3e,1,2,lVar1 + 0x3590,"vw1->weights.sparse",lVar2 + 0x3590,
             "vw2->weights.sparse");
  if (*(char *)(lVar1 + 0x3590) == '\x01') {
    check_weights_equal<sparse_parameters>
              ((sparse_parameters *)(lVar1 + 0x35b0),(sparse_parameters *)(lVar2 + 0x35b0));
  }
  else {
    check_weights_equal<dense_parameters>
              ((dense_parameters *)(lVar1 + 0x3598),(dense_parameters *)(lVar2 + 0x3598));
  }
  VW_ReleaseFeatureSpace(local_b8,2);
  VW_Finish(lVar1);
  VW_Finish(lVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vw_dll_parsed_and_constructed_example_parity)
{
  //parse example
  VW_HANDLE handle1 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_parsed;
  example_parsed = VW_ReadExampleA(handle1, "1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");

  //construct example
  VW_HANDLE handle2 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_constructed;
  auto fs = VW_InitializeFeatureSpaces(2);

  auto first = VW_GetFeatureSpace(fs, 0);
  VW_InitFeatures(first, 3);
  auto shash = VW_SetFeatureSpace(handle2, first, "s");
  VW_SetFeature(first, 0, VW_HashFeatureA(handle2, "p^the_man", shash), 1.0f);
  VW_SetFeature(first, 1, VW_HashFeatureA(handle2, "w^the", shash), 1.0f);
  VW_SetFeature(first, 2, VW_HashFeatureA(handle2, "w^man", shash), 1.0f);

  auto second = VW_GetFeatureSpace(fs, 1);
  VW_InitFeatures(second, 3);
  auto thash = VW_SetFeatureSpace(handle2, second, "t");
  VW_SetFeature(second, 0, VW_HashFeatureA(handle2, "p^un_homme", thash), 1.0f);
  VW_SetFeature(second, 1, VW_HashFeatureA(handle2, "w^un", thash), 1.0f);
  VW_SetFeature(second, 2, VW_HashFeatureA(handle2, "w^homme", thash), 1.0f);

  example_constructed = VW_ImportExample(handle2, "1", fs, 2);


  // learn both
  auto score_parsed = VW_Learn(handle1, example_parsed);
  auto score_constructed = VW_Learn(handle2, example_parsed);


  //check parity
  BOOST_CHECK_EQUAL(score_parsed, score_constructed);
  auto vw1 = static_cast<vw*>(handle1);
  auto vw2 = static_cast<vw*>(handle2);

  BOOST_CHECK_EQUAL(vw1->weights.sparse, vw2->weights.sparse);

  if (vw1->weights.sparse) {
    check_weights_equal(vw1->weights.sparse_weights, vw2->weights.sparse_weights);
  }
  else {
    check_weights_equal(vw1->weights.dense_weights, vw2->weights.dense_weights);
  }

  VW_ReleaseFeatureSpace(fs, 2);

  VW_Finish(handle1);
  VW_Finish(handle2);
}